

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

void * qemu_map_ram_ptr_x86_64(uc_struct_conflict *uc,RAMBlock *ram_block,ram_addr_t addr)

{
  if (ram_block == (RAMBlock *)0x0) {
    ram_block = qemu_get_ram_block(uc,addr);
    addr = addr - ram_block->offset;
  }
  if ((ram_block->host != (uint8_t *)0x0) && (addr < ram_block->used_length)) {
    return ram_block->host + addr;
  }
  __assert_fail("offset_in_ramblock(block, offset)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/exec/ram_addr.h"
                ,0x22,"void *ramblock_ptr(RAMBlock *, ram_addr_t)");
}

Assistant:

void *qemu_map_ram_ptr(struct uc_struct *uc, RAMBlock *ram_block, ram_addr_t addr)
{
    RAMBlock *block = ram_block;

    if (block == NULL) {
        block = qemu_get_ram_block(uc, addr);
        addr -= block->offset;
    }

    return ramblock_ptr(block, addr);
}